

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int spng_set_gama_int(spng_ctx *ctx,uint32_t gamma)

{
  int ret;
  uint32_t gamma_local;
  spng_ctx *ctx_local;
  
  if ((ctx == (spng_ctx *)0x0) || (ctx == (spng_ctx *)0x0)) {
    ctx_local._4_4_ = 1;
  }
  else if ((ctx->data == (uchar *)0x0) && ((*(ushort *)&ctx->field_0xcc >> 4 & 1) == 0)) {
    ctx_local._4_4_ = 0x52;
  }
  else {
    ctx_local._4_4_ = read_chunks(ctx,0);
    if (ctx_local._4_4_ == 0) {
      if (gamma == 0) {
        ctx_local._4_4_ = 1;
      }
      else if (gamma < 0x80000000) {
        ctx->gama = gamma;
        ctx->stored = (spng_chunk_bitfield)((uint)ctx->stored & 0xffffffef | 0x10);
        ctx->user = (spng_chunk_bitfield)((uint)ctx->user & 0xffffffef | 0x10);
        ctx_local._4_4_ = 0;
      }
      else {
        ctx_local._4_4_ = 1;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int spng_set_gama_int(spng_ctx *ctx, uint32_t gamma)
{
    SPNG_SET_CHUNK_BOILERPLATE(ctx);

    if(!gamma) return 1;
    if(gamma > spng_u32max) return 1;

    ctx->gama = gamma;

    ctx->stored.gama = 1;
    ctx->user.gama = 1;

    return 0;
}